

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10310e3::BlendA64Mask1DTestHBD_ExtremeValues_Test::TestBody
          (BlendA64Mask1DTestHBD_ExtremeValues_Test *this)

{
  short sVar1;
  int iVar2;
  long in_RDI;
  int bsize;
  int i_1;
  int i;
  int lo;
  int hi;
  int in_stack_0000005c;
  BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
  *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 local_18;
  undefined4 local_14;
  
  *(undefined4 *)(in_RDI + 0xa0158) = 8;
  while (*(int *)(in_RDI + 0xa0158) < 0xd) {
    sVar1 = (short)(1 << ((byte)*(undefined4 *)(in_RDI + 0xa0158) & 0x1f)) + -2;
    for (local_14 = 0; local_14 < 0x14000; local_14 = local_14 + 1) {
      iVar2 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_RDI >> 0x20));
      *(short *)(in_RDI + 0x38 + (long)local_14 * 2) = (short)iVar2 + sVar1;
      iVar2 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_RDI >> 0x20));
      *(short *)(in_RDI + 0x28038 + (long)local_14 * 2) = (short)iVar2 + sVar1;
      iVar2 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_RDI >> 0x20));
      *(short *)(in_RDI + 0x50040 + (long)local_14 * 2) = (short)iVar2 + sVar1;
      iVar2 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_RDI >> 0x20));
      *(short *)(in_RDI + 0x78048 + (long)local_14 * 2) = (short)iVar2 + sVar1;
    }
    for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
      iVar2 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_RDI >> 0x20));
      *(char *)(in_RDI + 0xa0050 + (long)local_18) = (char)iVar2 + '?';
    }
    for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < 0x16;
        in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
      BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      ::Common(in_stack_00000060,in_stack_0000005c);
    }
    *(int *)(in_RDI + 0xa0158) = *(int *)(in_RDI + 0xa0158) + 2;
  }
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, ExtremeValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    const int hi = 1 << bit_depth_;
    const int lo = hi - 2;

    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_(hi - lo) + lo;
      dst_tst_[i] = rng_(hi - lo) + lo;
      src0_[i] = rng_(hi - lo) + lo;
      src1_[i] = rng_(hi - lo) + lo;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(2) + AOM_BLEND_A64_MAX_ALPHA - 1;

    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      Common(bsize);
    }
  }
}